

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O2

void __thiscall wasm::CodeFolding::doWalkFunction(CodeFolding *this,Function *func)

{
  pointer pTVar1;
  byte bVar2;
  FeaturePolicy in_ECX;
  
  this->anotherPass = true;
  bVar2 = 1;
  while ((bVar2 & 1) != 0) {
    this->anotherPass = false;
    this->needEHFixups = false;
    Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>::walk
              ((Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                *)&(this->
                   super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
                   ).
                   super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
               ,&func->body);
    optimizeTerminatingTails(this,&this->unreachableTails,0);
    optimizeTerminatingTails(this,&this->returnTails,0);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>_>_>
    ::clear(&(this->breakTails)._M_t);
    pTVar1 = (this->unreachableTails).
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->unreachableTails).
        super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
      (this->unreachableTails).
      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    pTVar1 = (this->returnTails).
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->returnTails).
        super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
      (this->returnTails).
      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear(&(this->unoptimizables)._M_t);
    std::
    _Rb_tree<wasm::Expression_*,_wasm::Expression_*,_std::_Identity<wasm::Expression_*>,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
    ::clear(&(this->modifieds)._M_t);
    if (this->needEHFixups == true) {
      EHUtils::handleBlockNestedPops
                ((EHUtils *)func,
                 (Function *)
                 (this->
                 super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
                 ).
                 super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                 .
                 super_PostWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                 .
                 super_Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                 .currModule,(Module *)0x0,in_ECX);
    }
    bVar2 = this->anotherPass;
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    anotherPass = true;
    while (anotherPass) {
      anotherPass = false;
      needEHFixups = false;
      Super::doWalkFunction(func);
      optimizeTerminatingTails(unreachableTails);
      // optimize returns at the end, so we can benefit from a fallthrough if
      // there is a value TODO: separate passes for them?
      optimizeTerminatingTails(returnTails);
      // TODO add fallthrough for returns
      // TODO optimize returns not in blocks, a big return value can be worth it
      // clean up
      breakTails.clear();
      unreachableTails.clear();
      returnTails.clear();
      unoptimizables.clear();
      modifieds.clear();
      if (needEHFixups) {
        EHUtils::handleBlockNestedPops(func, *getModule());
      }
    }
  }